

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O1

void __thiscall MeCab::Param::set<int>(Param *this,char *key,int *value,bool rewrite)

{
  int iVar1;
  iterator iVar2;
  long *plVar3;
  istream *piVar4;
  mapped_type *this_00;
  undefined7 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  string key2;
  stringstream interpreter;
  ulong *local_210;
  undefined8 local_208;
  undefined1 local_200;
  undefined7 uStack_1ff;
  undefined8 uStack_1f8;
  ulong *local_1f0;
  undefined8 local_1e8;
  ulong local_1e0;
  undefined8 uStack_1d8;
  key_type local_1d0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  allocator local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::string::string((string *)&local_1d0,key,local_1a0);
  if ((int)CONCAT71(in_register_00000009,rewrite) == 0) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->conf_)._M_t,&local_1d0);
    if ((_Rb_tree_header *)iVar2._M_node != &(this->conf_)._M_t._M_impl.super__Rb_tree_header)
    goto LAB_0016c9ab;
  }
  iVar1 = *value;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  local_208 = 0;
  local_200 = 0;
  local_210 = (ulong *)&local_200;
  plVar3 = (long *)std::ostream::operator<<(local_190,iVar1);
  if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
    piVar4 = std::operator>>((istream *)local_1a0,(string *)&local_210);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) goto LAB_0016c903;
    piVar4 = std::ws<char,std::char_traits<char>>((istream *)local_1a0);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 2) == 0) goto LAB_0016c903;
    local_1f0 = &local_1e0;
    if (local_210 == (ulong *)&local_200) {
      uStack_1d8 = uStack_1f8;
    }
    else {
      local_1f0 = local_210;
    }
    local_1e0 = CONCAT71(uStack_1ff,local_200);
    local_1e8 = local_208;
    local_208 = 0;
    local_200 = 0;
    local_210 = (ulong *)&local_200;
  }
  else {
LAB_0016c903:
    local_1b0.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
    ((local_1b0.ptr_)->_M_dataplus)._M_p = (pointer)&(local_1b0.ptr_)->field_2;
    (local_1b0.ptr_)->_M_string_length = 0;
    ((local_1b0.ptr_)->field_2)._M_local_buf[0] = '\0';
    local_1b0._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_0019de18;
    local_1f0 = &local_1e0;
    local_1e8 = 0;
    local_1e0 = local_1e0 & 0xffffffffffffff00;
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&local_1b0);
  }
  if (local_210 != (ulong *)&local_200) {
    operator_delete(local_210);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->conf_,&local_1d0);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_1f0);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
LAB_0016c9ab:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void set(const char* key, const T &value,
           bool rewrite = true) {
    std::string key2 = std::string(key);
    if (rewrite || (!rewrite && conf_.find(key2) == conf_.end()))
      conf_[key2] = lexical_cast<std::string, T>(value);
  }